

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void relational_suite::compare_wstring_with_null_literal(void)

{
  undefined1 local_21d;
  nullable local_21c;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1df [2];
  undefined1 local_1dd;
  nullable local_1dc;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19f [2];
  undefined1 local_19d;
  nullable local_19c;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15f [2];
  undefined1 local_15d;
  nullable local_15c;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11f [2];
  undefined1 local_11d;
  nullable local_11c;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_df [2];
  undefined1 local_dd;
  nullable local_dc;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9f [2];
  undefined1 local_9d;
  nullable local_9c;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [17];
  undefined1 local_4d;
  nullable local_4c;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"");
  local_4c = null;
  local_a[0] = trial::dynamic::operator<(&local_48,&local_4c);
  local_4d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") < null","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c45,"void relational_suite::compare_wstring_with_null_literal()",local_a,&local_4d)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_98,L"");
  local_9c = null;
  local_5e[0] = trial::dynamic::operator<=(&local_98,&local_9c);
  local_9d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") <= null","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c46,"void relational_suite::compare_wstring_with_null_literal()",local_5e,&local_9d
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,L"");
  local_dc = null;
  local_9f[0] = trial::dynamic::operator>(&local_d8,&local_dc);
  local_dd = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") > null","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c47,"void relational_suite::compare_wstring_with_null_literal()",local_9f,&local_dd
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_118,L"");
  local_11c = null;
  local_df[0] = trial::dynamic::operator>=(&local_118,&local_11c);
  local_11d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") >= null","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c48,"void relational_suite::compare_wstring_with_null_literal()",local_df,
             &local_11d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158,L"bravo");
  local_15c = null;
  local_11f[0] = trial::dynamic::operator<(&local_158,&local_15c);
  local_15d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") < null","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c4a,"void relational_suite::compare_wstring_with_null_literal()",local_11f,
             &local_15d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,L"bravo");
  local_19c = null;
  local_15f[0] = trial::dynamic::operator<=(&local_198,&local_19c);
  local_19d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") <= null","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c4b,"void relational_suite::compare_wstring_with_null_literal()",local_15f,
             &local_19d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1d8,L"bravo");
  local_1dc = null;
  local_19f[0] = trial::dynamic::operator>(&local_1d8,&local_1dc);
  local_1dd = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") > null","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c4c,"void relational_suite::compare_wstring_with_null_literal()",local_19f,
             &local_1dd);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_218,L"bravo");
  local_21c = null;
  local_1df[0] = trial::dynamic::operator>=(&local_218,&local_21c);
  local_21d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") >= null","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c4d,"void relational_suite::compare_wstring_with_null_literal()",local_1df,
             &local_21d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  return;
}

Assistant:

void compare_wstring_with_null_literal()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") < null, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") <= null, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") > null, true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") >= null, true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") < null, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") <= null, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") > null, true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") >= null, true);
}